

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

mbedtls_mpi_uint
mbedtls_mpi_core_add(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  mbedtls_mpi_uint t;
  size_t i;
  mbedtls_mpi_uint c;
  size_t limbs_local;
  mbedtls_mpi_uint *B_local;
  mbedtls_mpi_uint *A_local;
  mbedtls_mpi_uint *X_local;
  
  i = 0;
  for (t = 0; t < limbs; t = t + 1) {
    uVar1 = B[t] + i + A[t];
    i = (long)(int)(uint)(uVar1 < B[t]) + (long)(int)(uint)(i + A[t] < A[t]);
    X[t] = uVar1;
  }
  return i;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint t = c + A[i];
        c = (t < A[i]);
        t += B[i];
        c += (t < B[i]);
        X[i] = t;
    }

    return c;
}